

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::writeInfo(Highs *this,string *filename)

{
  bool bVar1;
  undefined8 uVar2;
  string *in_RSI;
  string *in_RDI;
  HighsFileType file_type;
  FILE *file;
  HighsStatus return_status;
  HighsLogOptions *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  FILE *in_stack_fffffffffffffe28;
  allocator *paVar3;
  HighsFileType *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  string *psVar4;
  HighsStatus in_stack_fffffffffffffe68;
  HighsStatus in_stack_fffffffffffffe6c;
  HighsLogOptions *in_stack_fffffffffffffe70;
  allocator local_109;
  string local_108 [39];
  undefined1 local_e1 [49];
  string local_b0 [136];
  FILE *local_28;
  HighsStatus local_1c;
  string *local_18;
  HighsStatus local_4;
  
  local_1c = 0;
  local_18 = in_RSI;
  HighsLogOptions::HighsLogOptions
            ((HighsLogOptions *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe18);
  std::__cxx11::string::string(local_b0,local_18);
  psVar4 = (string *)local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_e1 + 1),"writeInfo",(allocator *)psVar4);
  openWriteFile((Highs *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),in_RDI,psVar4
                ,(FILE **)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                in_stack_fffffffffffffe48);
  paVar3 = &local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"openWriteFile",paVar3);
  local_1c = interpretCallStatus(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                                 in_stack_fffffffffffffe68,in_RDI);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string((string *)(local_e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e1);
  std::__cxx11::string::~string(local_b0);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x484c2b);
  if (local_1c == kError) {
    local_4 = local_1c;
  }
  else {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                            (char *)in_stack_fffffffffffffe18);
    if (bVar1) {
      psVar4 = in_RDI + 0x71;
      uVar2 = std::__cxx11::string::c_str();
      highsLogUser((HighsLogOptions *)&psVar4->_M_string_length,kInfo,
                   "Writing the info values to %s\n",uVar2);
    }
    HighsLogOptions::HighsLogOptions
              ((HighsLogOptions *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18);
    writeInfoToFile(in_stack_fffffffffffffe28,SUB41((uint)in_stack_fffffffffffffe24 >> 0x18,0),
                    (vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *)in_stack_fffffffffffffe18
                    ,kMinimal);
    paVar3 = (allocator *)&stack0xfffffffffffffe6f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe70,"writeInfoToFile",paVar3);
    local_1c = interpretCallStatus(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                                   in_stack_fffffffffffffe68,in_RDI);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe6f);
    HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x484e27);
    if (local_28 != _stdout) {
      fclose(local_28);
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::writeInfo(const std::string& filename) const {
  HighsStatus return_status = HighsStatus::kOk;
  FILE* file;
  HighsFileType file_type;
  return_status =
      interpretCallStatus(options_.log_options,
                          openWriteFile(filename, "writeInfo", file, file_type),
                          return_status, "openWriteFile");
  if (return_status == HighsStatus::kError) return return_status;
  // Report to user that options are being written to a file
  if (filename != "")
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Writing the info values to %s\n", filename.c_str());
  return_status = interpretCallStatus(
      options_.log_options,
      writeInfoToFile(file, info_.valid, info_.records, file_type),
      return_status, "writeInfoToFile");
  if (file != stdout) fclose(file);
  return return_status;
}